

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O3

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  byte bVar1;
  undefined1 uVar2;
  HSQUIRRELVM pSVar3;
  int iVar4;
  long lVar5;
  SQChar *pSVar6;
  long lVar7;
  long lVar8;
  longlong lVar9;
  size_t sVar10;
  SQRESULT SVar11;
  undefined1 auVar12 [8];
  long lVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  HSQUIRRELVM pSVar18;
  SQInteger ti;
  SQFloat tf;
  SQChar *ts;
  SQChar fmt [20];
  SQChar *format;
  char *local_a8;
  long local_a0;
  size_t local_98;
  HSQUIRRELVM local_90;
  float local_84;
  undefined1 local_80 [8];
  char local_78;
  undefined1 local_77 [23];
  long local_60;
  long local_58;
  SQInteger *local_50;
  SQChar **local_48;
  long local_40;
  long local_38;
  
  local_50 = outlen;
  local_48 = output;
  sq_getstring(v,nformatstringidx,&local_58);
  lVar5 = sq_getsize(v,nformatstringidx);
  local_90 = v;
  pSVar6 = (SQChar *)sq_getscratchpad(v,lVar5 + 2U);
  if (lVar5 < 1) {
    lVar16 = 0;
LAB_001099dc:
    *local_50 = lVar16;
    pSVar6[lVar16] = '\0';
    *local_48 = pSVar6;
    return 0;
  }
  lVar13 = nformatstringidx + 1;
  lVar16 = 0;
  lVar17 = 0;
  local_a0 = 0;
  local_98 = lVar5 + 2U;
  local_38 = lVar5;
LAB_00109677:
  pSVar18 = local_90;
  if (*(char *)(local_58 + lVar17) == '%') {
    if (*(char *)(local_58 + 1 + lVar17) == '%') {
      pSVar6[lVar16] = '%';
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 2;
      goto LAB_00109975;
    }
    lVar7 = sq_gettop(local_90);
    lVar5 = local_58;
    pSVar3 = local_90;
    if (lVar7 < lVar13) {
      pcVar15 = "not enough parameters for the given format string";
      goto LAB_00109a24;
    }
    lVar7 = lVar17 + 1;
    local_78 = '%';
    pcVar15 = (char *)(lVar17 + local_58 + 2);
    lVar17 = lVar17 + 2;
    lVar14 = lVar7;
    while (((ulong)*(byte *)(local_58 + lVar14) < 0x31 &&
           ((0x1280900000000U >> ((ulong)*(byte *)(local_58 + lVar14) & 0x3f) & 1) != 0))) {
      lVar14 = lVar14 + 1;
      lVar17 = lVar17 + 1;
      pcVar15 = pcVar15 + 1;
    }
    lVar8 = 0;
    do {
      local_60 = lVar13;
      if (9 < (int)*(char *)(local_58 + lVar14) - 0x30U) {
        *(undefined1 *)((long)&local_a8 + lVar8) = 0;
        if (lVar8 == 0) {
          local_a0 = 0;
        }
        else {
          local_40 = lVar7;
          local_a0 = strtoll((char *)&local_a8,(char **)local_80,10);
          lVar7 = local_40;
        }
        lVar13 = local_60;
        if (*(char *)(lVar5 + lVar14) != '.') goto LAB_001097e9;
        lVar8 = 0;
        goto LAB_00109789;
      }
      *(char *)((long)&local_a8 + lVar8) = *(char *)(local_58 + lVar14);
      lVar14 = lVar14 + 1;
      lVar8 = lVar8 + 1;
      lVar17 = lVar17 + 1;
      pcVar15 = pcVar15 + 1;
    } while (lVar8 != 3);
    lVar14 = sq_throwerror(local_90,"width format too long");
    lVar13 = local_60;
    pSVar18 = pSVar3;
    goto LAB_0010982e;
  }
  pSVar6[lVar16] = *(char *)(local_58 + lVar17);
  lVar16 = lVar16 + 1;
  lVar17 = lVar17 + 1;
  goto LAB_00109975;
LAB_00109789:
  if ((int)*pcVar15 - 0x30U < 10) goto code_r0x00109796;
  *(undefined1 *)((long)&local_a8 + lVar8) = 0;
  lVar14 = lVar17;
  if (lVar8 != 0) {
    lVar9 = strtoll((char *)&local_a8,(char **)local_80,10);
    local_a0 = local_a0 + lVar9;
  }
LAB_001097e9:
  lVar17 = lVar14 - lVar7;
  if (0x14 < lVar17) {
    pcVar15 = "format too long";
    goto LAB_00109804;
  }
  memcpy(local_77,(void *)(lVar5 + lVar7),lVar17 + 1);
  local_77[lVar17 + 1] = 0;
  pSVar18 = local_90;
  goto LAB_0010982e;
code_r0x00109796:
  *(char *)((long)&local_a8 + lVar8) = *pcVar15;
  lVar8 = lVar8 + 1;
  lVar17 = lVar17 + 1;
  pcVar15 = pcVar15 + 1;
  if (lVar8 == 3) goto code_r0x001097a8;
  goto LAB_00109789;
code_r0x001097a8:
  pcVar15 = "precision format too long";
LAB_00109804:
  pSVar18 = local_90;
  lVar14 = sq_throwerror(local_90,pcVar15);
LAB_0010982e:
  if (lVar14 < 0) {
    return -1;
  }
  local_80 = (undefined1  [8])0x0;
  local_a8 = (char *)0x0;
  local_84 = 0.0;
  bVar1 = *(byte *)(local_58 + lVar14);
  if (bVar1 < 99) {
    if ((bVar1 == 0x45) || (bVar1 == 0x47)) {
switchD_00109877_caseD_65:
      lVar5 = sq_getfloat(pSVar18,lVar13,&local_84);
      if (-1 < lVar5) {
        sVar10 = local_98 + local_a0 + 0x66;
        pSVar6 = (SQChar *)sq_getscratchpad(pSVar18,sVar10);
        local_98 = sVar10;
        iVar4 = snprintf(pSVar6 + lVar16,sVar10,&local_78,(double)local_84);
        goto LAB_00109965;
      }
      pcVar15 = "float expected for the specified format";
      goto LAB_00109a24;
    }
    if (bVar1 != 0x58) goto switchD_00109877_caseD_68;
switchD_00109877_caseD_64:
    sVar10 = strlen(&local_78);
    uVar2 = local_80[sVar10 + 7];
    *(undefined2 *)(local_80 + sVar10 + 7) = 0x6c6c;
    local_77[sVar10] = uVar2;
    local_77[sVar10 + 1] = 0;
    goto switchD_00109877_caseD_63;
  }
  switch(bVar1) {
  case 99:
switchD_00109877_caseD_63:
    lVar5 = sq_getinteger(pSVar18,lVar13,&local_a8);
    if (lVar5 < 0) {
      pcVar15 = "integer expected for the specified format";
LAB_00109a24:
      SVar11 = sq_throwerror(pSVar18,pcVar15);
      return SVar11;
    }
    sVar10 = local_98 + local_a0 + 0x66;
    pSVar6 = (SQChar *)sq_getscratchpad(pSVar18,sVar10);
    auVar12 = (undefined1  [8])local_a8;
    break;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    goto switchD_00109877_caseD_64;
  case 0x65:
  case 0x66:
  case 0x67:
    goto switchD_00109877_caseD_65;
  default:
switchD_00109877_caseD_68:
    pcVar15 = "invalid format";
    goto LAB_00109a24;
  case 0x73:
    lVar5 = sq_getstring(pSVar18,lVar13,local_80);
    if (lVar5 < 0) {
      pcVar15 = "string expected for the specified format";
      goto LAB_00109a24;
    }
    lVar5 = sq_getsize(pSVar18,lVar13);
    sVar10 = local_98 + local_a0 + lVar5 + 2;
    pSVar6 = (SQChar *)sq_getscratchpad(pSVar18,sVar10);
    auVar12 = local_80;
  }
  local_98 = sVar10;
  iVar4 = snprintf(pSVar6 + lVar16,sVar10,&local_78,auVar12);
LAB_00109965:
  lVar16 = lVar16 + iVar4;
  lVar17 = lVar14 + 1;
  lVar13 = lVar13 + 1;
  lVar5 = local_38;
LAB_00109975:
  if (lVar5 <= lVar17) goto LAB_001099dc;
  goto LAB_00109677;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    sq_getstring(v,nformatstringidx,&format);
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}